

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_Parse(char *value)

{
  char *pcVar1;
  cJSON *c;
  char *value_local;
  
  value_local = (char *)cJSON_New_Item();
  ep = (char *)0x0;
  if ((cJSON *)value_local == (cJSON *)0x0) {
    value_local = (char *)0x0;
  }
  else {
    pcVar1 = skip(value);
    pcVar1 = parse_value((cJSON *)value_local,pcVar1);
    if (pcVar1 == (char *)0x0) {
      cJSON_Delete((cJSON *)value_local);
      value_local = (char *)0x0;
    }
  }
  return (cJSON *)value_local;
}

Assistant:

cJSON *cJSON_Parse(const char *value)
{
	cJSON *c=cJSON_New_Item();
	ep=0;
	if (!c) return 0;       /* memory fail */

	if (!parse_value(c,skip(value))) {cJSON_Delete(c);return 0;}
	return c;
}